

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_string(TextReader *this,string *result)

{
  char *pcVar1;
  char *pcVar2;
  string *out;
  byte *pbVar3;
  ritobin *this_00;
  ulong uVar4;
  string_view data;
  string_view data_00;
  
  pbVar3 = (byte *)this->cur_;
  this_00 = (ritobin *)(this->cap_ + -(long)pbVar3);
  while( true ) {
    if (pbVar3 == (byte *)this->cap_) {
      return false;
    }
    uVar4 = (ulong)*pbVar3;
    if (0x27 < uVar4) {
      return false;
    }
    if ((0x100002200U >> (uVar4 & 0x3f) & 1) == 0) break;
    pbVar3 = pbVar3 + 1;
    this->cur_ = (char *)pbVar3;
    this_00 = this_00 + -1;
  }
  out = (string *)0x8400000000;
  if ((0x8400000000U >> (uVar4 & 0x3f) & 1) == 0) {
    return false;
  }
  data._M_str = (char *)0x100002200;
  data._M_len = (size_t)pbVar3;
  pcVar1 = str_unquote_fetch_end(this_00,data);
  if (pcVar1 == this->cap_) {
    return false;
  }
  result->_M_string_length = 0;
  *(result->_M_dataplus)._M_p = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (result,(long)pcVar1 - (long)this->cur_);
  data_00._M_len = this->cur_ + 1;
  this->cur_ = data_00._M_len;
  data_00._M_str = (char *)result;
  pcVar2 = str_unquote((ritobin *)(pcVar1 + -(long)data_00._M_len),data_00,out);
  this->cur_ = pcVar2;
  if (pcVar2 != pcVar1) {
    return false;
  }
  this->cur_ = pcVar2 + 1;
  return true;
}

Assistant:

bool read_string(std::string& result) noexcept {
            // FIXME: unicode verification
            while (!is_eof() && one_of<' ', '\t', '\r'>(*cur_)) {
                cur_++;
            }
            if (cur_ == cap_) {
                return false;
            }
            if (*cur_ != '"' && *cur_ != '\'') {
                return false;
            }
            auto quote_end = str_unquote_fetch_end(std::string_view{cur_, (size_t)(cap_ - cur_)});
            if (quote_end == cap_) {
                return false;
            }
            result.clear();
            result.reserve(quote_end - cur_);
            ++cur_;
            cur_ = str_unquote(std::string_view{cur_, (size_t)(quote_end - cur_)}, result);
            if (cur_ != quote_end) {
                return false;
            }
            cur_++;
            return true;
        }